

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::GetFullExtensionName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  FieldDescriptor *descriptor_00;
  FieldDescriptor *descriptor_01;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (*(csharp **)(this + 0x60) == (csharp *)0x0) {
    GetExtensionClassUnqualifiedName_abi_cxx11_
              (&local_38,*(csharp **)(this + 0x28),(FileDescriptor *)descriptor);
    std::operator+(&local_58,&local_38,".");
    GetPropertyName_abi_cxx11_(&sStack_78,this,descriptor_01);
    std::operator+(__return_storage_ptr__,&local_58,&sStack_78);
  }
  else {
    GetClassName_abi_cxx11_(&local_38,*(csharp **)(this + 0x60),(Descriptor *)descriptor);
    std::operator+(&local_58,&local_38,".Extensions.");
    GetPropertyName_abi_cxx11_(&sStack_78,this,descriptor_00);
    std::operator+(__return_storage_ptr__,&local_58,&sStack_78);
  }
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullExtensionName(const FieldDescriptor* descriptor) {
  if (descriptor->extension_scope()) {
    return GetClassName(descriptor->extension_scope()) + ".Extensions." + GetPropertyName(descriptor);
  }
  else {
    return GetExtensionClassUnqualifiedName(descriptor->file())  + "." + GetPropertyName(descriptor);
  }
}